

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuilderTask.cpp
# Opt level: O0

void __thiscall
nigel::BuilderExecutable::generateNotification
          (BuilderExecutable *this,NT error,shared_ptr<nigel::Token> *token)

{
  value_type local_30;
  shared_ptr<nigel::Token> *local_20;
  shared_ptr<nigel::Token> *token_local;
  BuilderExecutable *pBStack_10;
  NT error_local;
  BuilderExecutable *this_local;
  
  local_20 = token;
  token_local._4_4_ = error;
  pBStack_10 = this;
  std::
  make_shared<nigel::CompileNotification,nigel::CompileNotification::Type&,std::shared_ptr<nigel::Token>&>
            ((Type *)&local_30,(shared_ptr<nigel::Token> *)((long)&token_local + 4));
  std::__cxx11::
  list<std::shared_ptr<nigel::CompileNotification>,_std::allocator<std::shared_ptr<nigel::CompileNotification>_>_>
  ::push_back(&this->notificationList,&local_30);
  std::shared_ptr<nigel::CompileNotification>::~shared_ptr(&local_30);
  return;
}

Assistant:

void BuilderExecutable::generateNotification( NT error, std::shared_ptr<Token> token )
	{
		notificationList.push_back( std::make_shared<CompileNotification>( error, token ) );
	}